

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh_modifiers.cpp
# Opt level: O3

ON_Displacement * __thiscall
ON_MeshModifiers::Displacement(ON_MeshModifiers *this,bool allow_creation)

{
  ON_Displacement *this_00;
  
  this_00 = this->m_impl->m_displacement;
  if (this_00 == (ON_Displacement *)0x0 && allow_creation) {
    this_00 = (ON_Displacement *)operator_new(0x18);
    ON_Displacement::ON_Displacement(this_00);
    this->m_impl->m_displacement = this_00;
  }
  return this_00;
}

Assistant:

ON_Displacement* ON_MeshModifiers::Displacement(bool allow_creation)
{
  if ((nullptr == m_impl->m_displacement) && allow_creation)
    m_impl->m_displacement = new ON_Displacement;

  return m_impl->m_displacement;
}